

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O1

void Dau_FunctionEnum(int nInputs,int nVars,int nNodeMax,int fUseTwo,int fReduce,int fVerbose)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  word **ppwVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_TtHieMan_t *pMan;
  Vec_Mem_t *p;
  Vec_Int_t *p_00;
  int *piVar7;
  word *pwVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  word *pwVar15;
  uint nVars_00;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  word *pwVar22;
  word *pwVar23;
  bool bVar24;
  bool bVar25;
  long local_200;
  ulong local_1e8;
  word tCur;
  ulong local_1a0 [4];
  word *local_180;
  word *local_178;
  word *local_170;
  word *local_168;
  ulong local_160;
  word *local_158;
  int local_150;
  int local_14c;
  word *local_148;
  word *local_140;
  word local_138;
  word *local_130;
  word *local_128;
  word *local_120;
  word *local_118;
  int local_110;
  int local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  word *local_f0;
  long local_e8;
  word tCur_1;
  word Truth [4];
  int Limit [32];
  
  local_110 = fUseTwo;
  local_10c = fReduce;
  iVar4 = clock_gettime(3,(timespec *)Limit);
  if (iVar4 < 0) {
    local_200 = -1;
  }
  else {
    local_200 = (long)Limit._8_8_ / 1000 + Limit._0_8_ * 1000000;
  }
  uVar11 = 1 << ((char)nInputs - 6U & 0x1f);
  if (nInputs < 7) {
    uVar11 = 1;
  }
  pMan = Abc_TtHieManStart(nInputs,5);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = uVar11;
  p->LogPageSze = 0x10;
  p->PageMask = 0xffff;
  p->iPage = -1;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x40000);
  p_00->pArray = piVar7;
  Limit[2] = 0;
  Limit[3] = 0;
  Limit[0x1c] = 0;
  Limit[0x1d] = 0;
  Limit[0x1e] = 0;
  Limit[0x1f] = 0;
  Limit[0x18] = 0;
  Limit[0x19] = 0;
  Limit[0x1a] = 0;
  Limit[0x1b] = 0;
  Limit[0x14] = 0;
  Limit[0x15] = 0;
  Limit[0x16] = 0;
  Limit[0x17] = 0;
  Limit[0x10] = 0;
  Limit[0x11] = 0;
  Limit[0x12] = 0;
  Limit[0x13] = 0;
  Limit[0xc] = 0;
  Limit[0xd] = 0;
  Limit[0xe] = 0;
  Limit[0xf] = 0;
  Limit[8] = 0;
  Limit[9] = 0;
  Limit[10] = 0;
  Limit[0xb] = 0;
  Limit[4] = 0;
  Limit[5] = 0;
  Limit[6] = 0;
  Limit[7] = 0;
  Limit[0] = 1;
  Limit[1] = 2;
  Truth[2] = 0;
  Truth[3] = 0;
  Truth[0] = 0;
  Truth[1] = 0;
  if (((6 < nInputs) || (nInputs < nVars)) || (nVars < 3)) {
    __assert_fail("nVars >= 3 && nVars <= nInputs && nInputs <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                  ,0x277,"void Dau_FunctionEnum(int, int, int, int, int, int)");
  }
  Vec_MemHashAlloc(p,0x10000);
  Vec_MemHashInsert(p,Truth);
  local_138 = 0;
  Vec_IntPush(p_00,0);
  Truth[0] = 0xaaaaaaaaaaaaaaaa;
  if (0 < (int)uVar11) {
    uVar12 = 0;
    do {
      Truth[uVar12] = ~Truth[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  Vec_MemHashInsert(p,Truth);
  Vec_IntPush(p_00,1);
  Dau_PrintStats(0,nInputs,nVars,p_00,0,2,0,0,local_200);
  local_108 = (ulong)(uint)nNodeMax;
  if (nNodeMax < 1) {
    nNodeMax = 0;
  }
  local_100 = (ulong)(nNodeMax + 1);
  uVar12 = 1;
  do {
    if (uVar12 == local_100) break;
    bVar24 = local_10c == 0;
    bVar25 = uVar12 != local_108;
    local_1e8 = (ulong)(uint)Limit[uVar12 - 1];
    local_150 = Limit[uVar12];
    iVar4 = (int)uVar12;
    local_160 = local_1e8;
    if (Limit[uVar12 - 1] < local_150) {
      local_f8 = uVar12 - 1;
      do {
        if (((int)local_160 < 0) || (uVar11 = (uint)local_1e8, p->nEntries <= (int)uVar11))
        goto LAB_0051a578;
        if (p_00->nSize <= (int)uVar11) goto LAB_0051a597;
        local_148 = p->ppPages[uVar11 >> ((byte)p->LogPageSze & 0x1f)];
        lVar17 = (long)(int)(p->PageMask & uVar11) * (long)p->nEntrySize;
        uVar1 = p_00->pArray[local_1e8];
        nVars_00 = uVar1 & 0xf;
        pwVar8 = (word *)(ulong)nVars_00;
        iVar5 = Dau_CountSymms2(local_148[lVar17],nVars_00);
        local_140 = (word *)CONCAT44(local_140._4_4_,iVar5);
        if (local_f8 != (uint)((int)uVar1 >> 0x10)) {
          __assert_fail("n-1 == (NodSup >> 16)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x28d,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        local_180 = pwVar8;
        if ((s_Truths6Neg[(long)pwVar8] &
            (local_148[lVar17] >> ((byte)(1L << (sbyte)nVars_00) & 0x3f) ^ local_148[lVar17])) != 0)
        {
          __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x28e,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        if (nVars_00 != 0) {
          local_14c = nVars_00 + 1;
          local_f0 = (word *)((long)pwVar8 + -1);
          local_168 = (word *)0xffffffffffffffff;
          pwVar8 = (word *)0x0;
          local_e8 = lVar17;
          do {
            iVar5 = local_14c;
            local_178 = pwVar8;
            if (((uint)local_140 >> ((uint)pwVar8 & 0x1f) & 1) == 0) {
              if (&DAT_00000005 < pwVar8) {
LAB_0051a559:
                __assert_fail("iVar >= 0 && iVar < 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x337,"word Abc_Tt6Cofactor0(word, int)");
              }
              uVar18 = s_Truths6Neg[(long)pwVar8] & local_148[local_e8];
              bVar10 = (byte)(1 << ((byte)pwVar8 & 0x1f));
              uVar19 = s_Truths6[(long)pwVar8];
              uVar14 = local_148[local_e8] & uVar19;
              uVar18 = uVar18 << (bVar10 & 0x3f) | uVar18;
              uVar14 = uVar14 >> (bVar10 & 0x3f) | uVar14;
              if ((int)nVars_00 < nInputs && (bVar25 || bVar24)) {
                uVar13 = s_Truths6[(long)local_180];
                uVar16 = uVar13 & uVar19;
                tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,local_14c,p,p_00,uVar11,local_200)
                ;
                tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,iVar5,p,p_00,uVar11,local_200);
                tCur = (uVar14 ^ uVar18) & (uVar13 ^ uVar19) ^ uVar18;
                Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,local_14c,p,p_00,uVar11,local_200)
                ;
                local_138 = local_138 + 3;
              }
              if (bVar25 || bVar24) {
                pwVar8 = (word *)((long)local_178 + 1);
                pwVar22 = s_Truths6;
                pwVar23 = (word *)0x0;
                local_170 = pwVar8;
                do {
                  if ((local_178 != pwVar23) &&
                     (pwVar8 == pwVar23 || ((uint)local_140 >> ((uint)pwVar23 & 0x1f) & 1) == 0)) {
                    uVar13 = *pwVar22;
                    uVar16 = uVar13 & uVar19;
                    tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                    Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                       local_200);
                    tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                    Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                       local_200);
                    uVar16 = ~uVar13 & uVar19;
                    tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                    Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                       local_200);
                    tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                    Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                       local_200);
                    tCur = (uVar14 ^ uVar18) & (uVar13 ^ uVar19) ^ uVar18;
                    Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                       local_200);
                    local_138 = local_138 + 5;
                    pwVar8 = local_170;
                  }
                  pwVar23 = (word *)((long)pwVar23 + 1);
                  pwVar22 = pwVar22 + 1;
                } while (local_180 != pwVar23);
              }
              local_158 = s_Truths6 + 1;
              local_130 = (word *)0x0;
              pwVar8 = local_168;
              pwVar22 = local_f0;
              do {
                pwVar23 = (word *)((long)local_130 + 1);
                local_118 = local_130;
                if ((local_130 != local_178) && (pwVar23 < local_180)) {
                  pwVar15 = (word *)0x0;
                  local_128 = pwVar8;
                  local_120 = pwVar22;
                  do {
                    local_130 = pwVar23;
                    if (pwVar8 != pwVar15) {
                      uVar19 = local_158[(long)pwVar15];
                      uVar13 = s_Truths6[(long)local_118];
                      uVar16 = uVar13 & uVar19;
                      tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                      local_170 = pwVar15;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      uVar16 = ~uVar13 & uVar19;
                      tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      uVar16 = ~uVar19 & uVar13;
                      tCur = uVar18 & ~uVar16 | uVar16 & uVar14;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      tCur = ~uVar16 & uVar14 | uVar16 & uVar18;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      uVar16 = uVar13 | uVar19;
                      tCur = uVar16 & uVar18 | uVar14 & ~uVar16;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      tCur = uVar16 & uVar14 | ~uVar16 & uVar18;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      uVar13 = uVar13 ^ uVar19;
                      tCur = uVar18 & ~uVar13 | uVar13 & uVar14;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      tCur = ~uVar13 & uVar14 | uVar13 & uVar18;
                      Dau_InsertFunction(pMan,&tCur,iVar4,nInputs,nVars,nVars_00,p,p_00,uVar11,
                                         local_200);
                      local_138 = local_138 + 10;
                      pwVar8 = local_128;
                      pwVar22 = local_120;
                      pwVar15 = local_170;
                    }
                    pwVar15 = (word *)((long)pwVar15 + 1);
                    pwVar23 = local_130;
                  } while (pwVar22 != pwVar15);
                }
                local_130 = pwVar23;
                pwVar8 = (word *)((long)pwVar8 + -1);
                local_158 = local_158 + 1;
                pwVar22 = (word *)((long)pwVar22 + -1);
              } while (local_130 != local_180);
            }
            pwVar8 = (word *)((long)local_178 + 1);
            local_168 = (word *)((long)local_168 + 1);
          } while (pwVar8 != local_180);
        }
        local_1e8 = local_1e8 + 1;
      } while ((int)local_1e8 < local_150);
    }
    iVar5 = 0;
    if ((2 < uVar12 && local_110 != 0) && (bVar25 || bVar24)) {
      pwVar8 = (word *)(ulong)(uint)Limit[uVar12 - 2];
      local_168 = pwVar8;
      if (Limit[uVar12 - 2] < (int)local_160) {
        local_148 = (word *)(uVar12 - 2);
        iVar5 = 0;
        do {
          if (((int)local_168 < 0) || (uVar11 = (uint)pwVar8, p->nEntries <= (int)uVar11)) {
LAB_0051a578:
            __assert_fail("i >= 0 && i < p->nEntries",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
          }
          if (p_00->nSize <= (int)uVar11) {
LAB_0051a597:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p_00->pArray[(long)pwVar8] >> 0x10 != (int)local_148) {
            __assert_fail("n-2 == (NodSup >> 16)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                          ,0x2f4,"void Dau_FunctionEnum(int, int, int, int, int, int)");
          }
          local_130 = p->ppPages[uVar11 >> ((byte)p->LogPageSze & 0x1f)];
          local_178 = (word *)((long)(int)(p->PageMask & uVar11) * (long)p->nEntrySize);
          uVar11 = p_00->pArray[(long)pwVar8] & 0xf;
          pwVar22 = (word *)(ulong)uVar11;
          local_158 = pwVar8;
          if ((s_Truths6Neg[(long)pwVar22] &
              (local_130[(long)local_178] >> ((byte)(1L << (sbyte)uVar11) & 0x3f) ^
              local_130[(long)local_178])) != 0) {
            __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                          ,0x2f5,"void Dau_FunctionEnum(int, int, int, int, int, int)");
          }
          if (uVar11 == 0) {
            iVar6 = (int)local_160;
          }
          else {
            pwVar8 = (word *)0x0;
            uVar19 = local_160;
            local_140 = pwVar22;
            local_118 = (word *)(ulong)uVar11;
            do {
              local_180 = (word *)(ulong)(uint)(1 << ((byte)pwVar8 & 0x1f));
              pwVar23 = (word *)0x0;
              local_128 = pwVar8;
              do {
                if (pwVar23 != pwVar8) {
                  if ((&DAT_00000005 < pwVar8) || (&DAT_00000005 < pwVar23)) goto LAB_0051a559;
                  uVar19 = s_Truths6[(long)pwVar8];
                  uVar13 = local_130[(long)local_178] & uVar19;
                  uVar18 = local_130[(long)local_178] & s_Truths6Neg[(long)pwVar8];
                  uVar18 = uVar18 << ((byte)local_180 & 0x3f) | uVar18;
                  uVar21 = uVar18 & s_Truths6Neg[(long)pwVar23];
                  bVar10 = (byte)(1 << ((byte)pwVar23 & 0x1f));
                  uVar14 = s_Truths6[(long)pwVar23];
                  uVar18 = uVar18 & uVar14;
                  uVar13 = uVar13 >> ((byte)local_180 & 0x3f) | uVar13;
                  uVar16 = s_Truths6Neg[(long)pwVar23] & uVar13;
                  uVar13 = uVar13 & uVar14;
                  local_170 = (word *)(uVar13 >> (bVar10 & 0x3f) | uVar13);
                  tCur = uVar14 & uVar19;
                  local_1a0[0] = ~uVar14 & uVar19;
                  local_1a0[1] = ~uVar19 & uVar14;
                  local_1a0[2] = uVar14 | uVar19;
                  local_1a0[3] = uVar14 ^ uVar19;
                  uVar14 = 0;
                  local_120 = pwVar23;
                  do {
                    pwVar22 = local_118;
                    pwVar8 = local_158;
                    if (uVar14 < 4) {
                      uVar19 = local_1a0[uVar14 - 1];
                      uVar20 = (uVar21 << (bVar10 & 0x3f) | uVar21) & ~uVar19 |
                               uVar19 & (uVar18 >> (bVar10 & 0x3f) | uVar18);
                      uVar9 = uVar19 & (ulong)local_170;
                      uVar13 = uVar14;
                      do {
                        tCur_1 = local_1a0[uVar13] &
                                 ((~uVar19 & (uVar16 << (bVar10 & 0x3f) | uVar16) | uVar9) ^ uVar20)
                                 ^ uVar20;
                        iVar6 = Dau_InsertFunction(pMan,&tCur_1,iVar4,nInputs,nVars,(int)pwVar22,p,
                                                   p_00,(int)pwVar8,local_200);
                        iVar5 = iVar5 + iVar6;
                        uVar13 = uVar13 + 1;
                      } while (uVar13 != 4);
                    }
                    uVar14 = uVar14 + 1;
                    uVar19 = local_160;
                    pwVar8 = local_128;
                    pwVar22 = local_140;
                    pwVar23 = local_120;
                  } while (uVar14 != 5);
                }
                iVar6 = (int)uVar19;
                pwVar23 = (word *)((long)pwVar23 + 1);
              } while (pwVar23 != pwVar22);
              pwVar8 = (word *)((long)pwVar8 + 1);
            } while (pwVar8 != pwVar22);
          }
          pwVar8 = (word *)((long)local_158 + 1);
        } while ((int)pwVar8 < iVar6);
      }
    }
    iVar6 = p_00->nSize;
    Limit[uVar12 + 1] = iVar6;
    iVar4 = Dau_PrintStats(iVar4,nInputs,nVars,p_00,local_150,iVar6,local_138,iVar5,local_200);
    uVar12 = uVar12 + 1;
  } while (iVar4 != 0);
  Dau_TablesSave(nInputs,nVars,p,p_00,p_00->nSize,local_200);
  iVar5 = 3;
  iVar4 = clock_gettime(3,(timespec *)&tCur);
  if (iVar4 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = (long)local_1a0[0] / 1000 + tCur * 1000000;
  }
  Abc_Print(iVar5,"%s =","Total time");
  Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar17 - local_200) / 1000000.0,0));
  Abc_TtHieManStop(pMan);
  if (p != (Vec_Mem_t *)0x0) {
    pVVar2 = p->vTable;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
      free(pVVar2);
      p->vTable = (Vec_Int_t *)0x0;
    }
    pVVar2 = p->vNexts;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
      free(pVVar2);
      p->vNexts = (Vec_Int_t *)0x0;
    }
    if (p != (Vec_Mem_t *)0x0) {
      uVar11 = p->iPage;
      if (-1 < (int)uVar11) {
        ppwVar3 = p->ppPages;
        lVar17 = 0;
        do {
          pwVar8 = ppwVar3[lVar17];
          if (pwVar8 != (word *)0x0) {
            free(pwVar8);
            ppwVar3[lVar17] = (word *)0x0;
          }
          lVar17 = lVar17 + 1;
        } while ((ulong)uVar11 + 1 != lVar17);
      }
      if (p->ppPages != (word **)0x0) {
        free(p->ppPages);
        p->ppPages = (word **)0x0;
      }
      free(p);
    }
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  if (p_00 != (Vec_Int_t *)0x0) {
    free(p_00);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose )
{
    abctime clk = Abc_Clock();
    int nWords = Abc_TtWordNum(nInputs); word nSteps = 0;
    Abc_TtHieMan_t * pMan = Abc_TtHieManStart( nInputs, 5 );
    Vec_Mem_t * vTtMem  = Vec_MemAlloc( nWords, 16 );
    Vec_Int_t * vNodSup = Vec_IntAlloc( 1 << 16 );
    int v, u, k, m, n, Entry, nNew, Limit[32] = {1, 2};
    word Truth[4] = {0};
    assert( nVars >= 3 && nVars <= nInputs && nInputs <= 6 );
    Vec_MemHashAlloc( vTtMem,  1<<16 );
    // add constant 0
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 0 ); // nodes=0, supp=0
    // add buffer/inverter
    Abc_TtIthVar( Truth, 0, nInputs );
    Abc_TtNot( Truth, nWords );
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 1 ); // nodes=0, supp=1
    Dau_PrintStats( 0, nInputs, nVars, vNodSup, 0, 2, nSteps, 0, clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n <= nNodeMax; n++ )
    {
        int Count2 = 0;
        int fExpand = !(fReduce && n == nNodeMax);
        for ( Entry = Limit[n-1]; Entry < Limit[n]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup;
            int SymVars = Dau_CountSymms2( pTruth[0], nSupp );
            assert( n-1 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ ) if ( (SymVars & (1 << v)) == 0 )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );
                // add one extra variable to support
                if ( nSupp < nInputs && fExpand )
                {
                    tGate = s_Truths6[v] & s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    nSteps += 3;
                }
                // add one cross bar
                if ( fExpand )
                for ( k = 0; k < nSupp; k++ ) if ( k != v && ((SymVars & (1 << k)) == 0 || k == v+1) )
                {
                    tGate = s_Truths6[v] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[v] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 5;
                }
                // add two cross bars
                for ( k = 0;   k < nSupp; k++ ) if ( k != v )//&& ((SymVars & (1 << k)) == 0) )
                for ( m = k+1; m < nSupp; m++ ) if ( m != v )//&& ((SymVars & (1 << m)) == 0 || m == k+1) )
                {
                    tGate = s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    
                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 10;
                }
            }
        } 
        if ( fUseTwo && n > 2 && fExpand )
        for ( Entry = Limit[n-2]; Entry < Limit[n-1]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup; int g1, g2;
            assert( n-2 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            for ( v = 0; v < nSupp; v++ )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, u );

                word tGates[5], tCur;
                tGates[0] =  s_Truths6[v] &  s_Truths6[u];
                tGates[1] =  s_Truths6[v] & ~s_Truths6[u];
                tGates[2] = ~s_Truths6[v] &  s_Truths6[u];
                tGates[3] =  s_Truths6[v] |  s_Truths6[u];
                tGates[4] =  s_Truths6[v] ^  s_Truths6[u];

                for ( g1 = 0;    g1 < 5; g1++ )
                for ( g2 = g1+1; g2 < 5; g2++ )
                {
                    Cof0  = (tGates[g1] & Cof01) | (~tGates[g1] & Cof00);
                    Cof1  = (tGates[g1] & Cof11) | (~tGates[g1] & Cof10);

                    tCur  = (tGates[g2] & Cof1)  | (~tGates[g2] & Cof0);
                    Count2 += Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );
                }
            }
        }
        Limit[n+1] = Vec_IntSize(vNodSup);
        nNew = Dau_PrintStats( n, nInputs, nVars, vNodSup, Limit[n], Limit[n+1], nSteps, Count2, clk );
        if ( nNew == 0 )
            break;
    }
    Dau_TablesSave( nInputs, nVars, vTtMem, vNodSup, Vec_IntSize(vNodSup), clk );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    //Dau_DumpFuncs( vTtMem, vNodSup, nVars, nNodeMax );
    //Dau_ExactNpnPrint( vTtMem, vNodSup, nVars, nInputs, n );
    Abc_TtHieManStop( pMan );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    Vec_IntFree( vNodSup );
    fflush(stdout);
}